

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O0

CachedInclude * search_cached_include(TCCState *s1,char *filename,int add)

{
  CachedInclude *pCVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int local_44;
  int i;
  CachedInclude *e;
  byte *pbStack_30;
  uint h;
  uchar *s;
  int add_local;
  char *filename_local;
  TCCState *s1_local;
  
  e._4_4_ = 1;
  for (pbStack_30 = (byte *)filename; *pbStack_30 != 0; pbStack_30 = pbStack_30 + 1) {
    e._4_4_ = e._4_4_ * 0x21 + (e._4_4_ >> 0x1b) + (uint)*pbStack_30;
  }
  uVar2 = e._4_4_ & 0x1f;
  local_44 = s1->cached_includes_hash[uVar2];
  while( true ) {
    if (local_44 == 0) {
      if (add == 0) {
        s1_local = (TCCState *)0x0;
      }
      else {
        sVar4 = strlen(filename);
        s1_local = (TCCState *)tcc_malloc(sVar4 + 0x10);
        strcpy((char *)&s1_local->nocommon,filename);
        s1_local->nostdinc = 0;
        s1_local->verbose = 0;
        dynarray_add(&s1->cached_includes,&s1->nb_cached_includes,s1_local);
        s1_local->nostdlib = s1->cached_includes_hash[uVar2];
        s1->cached_includes_hash[uVar2] = s1->nb_cached_includes;
      }
      return (CachedInclude *)s1_local;
    }
    pCVar1 = s1->cached_includes[local_44 + -1];
    iVar3 = strcmp(pCVar1->filename,filename);
    if (iVar3 == 0) break;
    local_44 = pCVar1->hash_next;
  }
  return pCVar1;
}

Assistant:

static CachedInclude* search_cached_include(TCCState* s1, const char* filename, int add) {
  const unsigned char* s;
  unsigned int h;
  CachedInclude* e;
  int i;

  h = TOK_HASH_INIT;
  s = (unsigned char*)filename;
  while (*s) {
#ifdef _WIN32
    h = TOK_HASH_FUNC(h, toup(*s));
#else
    h = TOK_HASH_FUNC(h, *s);
#endif
    s++;
  }
  h &= (CACHED_INCLUDES_HASH_SIZE - 1);

  i = s1->cached_includes_hash[h];
  for (;;) {
    if (i == 0)
      break;
    e = s1->cached_includes[i - 1];
    if (0 == PATHCMP(e->filename, filename))
      return e;
    i = e->hash_next;
  }
  if (!add)
    return NULL;

  e = tcc_malloc(sizeof(CachedInclude) + strlen(filename));
  strcpy(e->filename, filename);
  e->ifndef_macro = e->once = 0;
  dynarray_add(&s1->cached_includes, &s1->nb_cached_includes, e);
  /* add in hash table */
  e->hash_next = s1->cached_includes_hash[h];
  s1->cached_includes_hash[h] = s1->nb_cached_includes;
#ifdef INC_DEBUG
  printf("adding cached '%s'\n", filename);
#endif
  return e;
}